

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpdf_streams.c
# Opt level: O3

HPDF_STATUS HPDF_Stream_WriteToStreamWithDeflate(HPDF_Stream src,HPDF_Stream dst,HPDF_Encrypt e)

{
  HPDF_Stream stream;
  int iVar1;
  uint uVar2;
  HPDF_STATUS HVar3;
  ulong uVar4;
  HPDF_BYTE *pHVar5;
  HPDF_Error error;
  HPDF_UINT len;
  bool bVar6;
  HPDF_UINT size;
  z_stream strm;
  Bytef inbuf [4096];
  undefined1 auStack_3438 [8];
  undefined1 *local_3430;
  HPDF_Stream local_3428;
  HPDF_UINT local_341c;
  HPDF_Stream local_3418;
  ulong local_3410;
  HPDF_BYTE *local_3408;
  HPDF_UINT local_3400;
  HPDF_BYTE *local_33f0;
  uint local_33e8;
  HPDF_BYTE local_3398 [4528];
  HPDF_BYTE local_21e8 [4528];
  HPDF_BYTE local_1038 [4104];
  
  HVar3 = HPDF_Stream_Seek(src,0,HPDF_SEEK_SET);
  if (HVar3 == 0) {
    HPDF_MemSet(&local_3408,'\0',0x70);
    local_33e8 = 0x11a6;
    local_33f0 = local_21e8;
    iVar1 = deflateInit_(&local_3408,0xffffffff,"1.2.11",0x70);
    if (iVar1 == 0) {
      uVar4 = 0;
      local_3430 = auStack_3438;
      local_3428 = src;
      local_3418 = dst;
      local_3408 = local_1038;
      do {
        local_3400 = 0;
        local_341c = 0x1000;
        if (local_3428->read_fn == (HPDF_Stream_Read_Func)0x0) {
          HVar3 = HPDF_SetError(local_3428->error,0x1035,0);
        }
        else {
          HVar3 = (*local_3428->read_fn)(local_3428,local_1038,&local_341c);
        }
        stream = local_3418;
        local_3400 = local_341c;
        local_3408 = local_1038;
        if (HVar3 == 0) goto joined_r0x00132407;
        if (HVar3 != 0x1058) {
          deflateEnd(&local_3408);
          return HVar3;
        }
        uVar4 = 1;
        if (local_341c == 0) break;
        do {
          local_3410 = uVar4;
          uVar2 = deflate(&local_3408,0);
          if (1 < uVar2) goto LAB_0013252a;
          uVar4 = local_3410;
          if (local_33e8 == 0) {
            pHVar5 = local_21e8;
            if (e != (HPDF_Encrypt)0x0) {
              pHVar5 = local_3398;
              HPDF_Encrypt_CryptBuf(e,local_21e8,pHVar5,0x11a6);
            }
            HVar3 = HPDF_Stream_Write(stream,pHVar5,0x11a6);
            if (HVar3 != 0) {
              deflateEnd(&local_3408);
              error = local_3428->error;
              goto LAB_00132565;
            }
            local_33e8 = 0x11a6;
            uVar4 = local_3410;
            local_33f0 = local_21e8;
          }
joined_r0x00132407:
        } while (local_3400 != 0);
        bVar6 = (int)uVar4 == 0;
        uVar4 = (ulong)!bVar6;
      } while (bVar6);
      do {
        uVar2 = deflate(&local_3408,4);
        if (1 < uVar2) {
LAB_0013252a:
          HVar3 = (HPDF_STATUS)(int)uVar2;
          deflateEnd(&local_3408);
          error = local_3428->error;
LAB_00132565:
          HVar3 = HPDF_SetError(error,0x1066,HVar3);
          return HVar3;
        }
        if (local_33e8 < 0x11a6) {
          len = 0x11a6 - local_33e8;
          pHVar5 = local_21e8;
          if (e != (HPDF_Encrypt)0x0) {
            pHVar5 = local_3398;
            HPDF_Encrypt_CryptBuf(e,local_21e8,pHVar5,len);
          }
          HVar3 = HPDF_Stream_Write(local_3418,pHVar5,len);
          if (HVar3 != 0) {
            deflateEnd(&local_3408);
            error = local_3428->error;
            goto LAB_00132565;
          }
          local_33e8 = 0x11a6;
          local_33f0 = local_21e8;
        }
      } while (uVar2 != 1);
      deflateEnd(&local_3408);
      HVar3 = 0;
    }
    else {
      HVar3 = HPDF_SetError(src->error,0x1066,(long)iVar1);
    }
  }
  return HVar3;
}

Assistant:

HPDF_STATUS
HPDF_Stream_WriteToStreamWithDeflate  (HPDF_Stream  src,
                                       HPDF_Stream  dst,
                                       HPDF_Encrypt  e)
{
#ifdef LIBHPDF_HAVE_ZLIB

#define DEFLATE_BUF_SIZ  ((HPDF_INT)(HPDF_STREAM_BUF_SIZ * 1.1) + 13)

    HPDF_STATUS ret;
    HPDF_BOOL flg;

    z_stream strm;
    Bytef inbuf[HPDF_STREAM_BUF_SIZ];
    Bytef otbuf[DEFLATE_BUF_SIZ];
    HPDF_BYTE ebuf[DEFLATE_BUF_SIZ];

    HPDF_PTRACE((" HPDF_Stream_WriteToStreamWithDeflate\n"));

    /* initialize input stream */
    ret = HPDF_Stream_Seek (src, 0, HPDF_SEEK_SET);
    if (ret != HPDF_OK)
        return ret;

    /* initialize decompression stream. */
    HPDF_MemSet(&strm, 0x00, sizeof(z_stream));
    strm.next_out = otbuf;
    strm.avail_out = DEFLATE_BUF_SIZ;

    ret = deflateInit_(&strm, Z_DEFAULT_COMPRESSION, ZLIB_VERSION,
            sizeof(z_stream));
    if (ret != Z_OK)
        return HPDF_SetError (src->error, HPDF_ZLIB_ERROR, ret);

    strm.next_in = inbuf;
    strm.avail_in = 0;

    flg = HPDF_FALSE;
    for (;;) {
        HPDF_UINT size = HPDF_STREAM_BUF_SIZ;

        ret = HPDF_Stream_Read (src, inbuf, &size);

        strm.next_in = inbuf;
        strm.avail_in = size;

        if (ret != HPDF_OK) {
            if (ret == HPDF_STREAM_EOF) {
                flg = HPDF_TRUE;
                if (size == 0)
                    break;
            } else {
                deflateEnd(&strm);
                return ret;
            }
        }

        while (strm.avail_in > 0) {
            ret = deflate(&strm, Z_NO_FLUSH);
            if (ret != Z_OK && ret != Z_STREAM_END) {
                deflateEnd(&strm);
                return HPDF_SetError (src->error, HPDF_ZLIB_ERROR, ret);
            }

            if (strm.avail_out == 0) {
                if (e) {
                    HPDF_Encrypt_CryptBuf (e, otbuf, ebuf, DEFLATE_BUF_SIZ);
                    ret = HPDF_Stream_Write(dst, ebuf, DEFLATE_BUF_SIZ);
                } else
                    ret = HPDF_Stream_Write (dst, otbuf, DEFLATE_BUF_SIZ);

                if (ret != HPDF_OK) {
                    deflateEnd(&strm);
                    return HPDF_SetError (src->error, HPDF_ZLIB_ERROR, ret);
                }

                strm.next_out = otbuf;
                strm.avail_out = DEFLATE_BUF_SIZ;
            }
        }

        if (flg)
            break;
    }

    flg = HPDF_FALSE;
    for (;;) {
        ret = deflate(&strm, Z_FINISH);
        if (ret != Z_OK && ret != Z_STREAM_END) {
            deflateEnd(&strm);
            return HPDF_SetError (src->error, HPDF_ZLIB_ERROR, ret);
        }

        if (ret == Z_STREAM_END)
            flg = HPDF_TRUE;

        if (strm.avail_out < DEFLATE_BUF_SIZ) {
            HPDF_UINT osize = DEFLATE_BUF_SIZ - strm.avail_out;
            if (e) {
                HPDF_Encrypt_CryptBuf (e, otbuf, ebuf, osize);
                ret = HPDF_Stream_Write(dst, ebuf, osize);
            } else
                ret = HPDF_Stream_Write (dst, otbuf, osize);

            if (ret != HPDF_OK) {
                deflateEnd(&strm);
                return HPDF_SetError (src->error, HPDF_ZLIB_ERROR, ret);
            }

            strm.next_out = otbuf;
            strm.avail_out = DEFLATE_BUF_SIZ;
        }

        if (flg)
            break;
    }

    deflateEnd(&strm);
    return HPDF_OK;
#else /* LIBHPDF_HAVE_ZLIB */
    HPDF_UNUSED (e);
    HPDF_UNUSED (dst);
    HPDF_UNUSED (src);
    return HPDF_UNSUPPORTED_FUNC;
#endif /* LIBHPDF_HAVE_ZLIB */
}